

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O0

void Abc_ManResubStop(Abc_ManRes_t *p)

{
  Abc_ManRes_t *p_local;
  
  Vec_PtrFree(p->vDivs);
  Vec_PtrFree(p->vSims);
  Vec_PtrFree(p->vDivs1UP);
  Vec_PtrFree(p->vDivs1UN);
  Vec_PtrFree(p->vDivs1B);
  Vec_PtrFree(p->vDivs2UP0);
  Vec_PtrFree(p->vDivs2UP1);
  Vec_PtrFree(p->vDivs2UN0);
  Vec_PtrFree(p->vDivs2UN1);
  Vec_PtrFree(p->vTemp);
  if (p->pInfo != (uint *)0x0) {
    free(p->pInfo);
    p->pInfo = (uint *)0x0;
  }
  if (p != (Abc_ManRes_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Abc_ManResubStop( Abc_ManRes_t * p )
{
    Vec_PtrFree( p->vDivs );
    Vec_PtrFree( p->vSims );
    Vec_PtrFree( p->vDivs1UP );
    Vec_PtrFree( p->vDivs1UN );
    Vec_PtrFree( p->vDivs1B );
    Vec_PtrFree( p->vDivs2UP0 );
    Vec_PtrFree( p->vDivs2UP1 );
    Vec_PtrFree( p->vDivs2UN0 );
    Vec_PtrFree( p->vDivs2UN1 );
    Vec_PtrFree( p->vTemp );
    ABC_FREE( p->pInfo );
    ABC_FREE( p );
}